

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * kwssys::SystemTools::DecodeURL(string *url)

{
  ulong uVar1;
  undefined1 *puVar2;
  ulong uVar3;
  char *pcVar4;
  ulong in_RSI;
  string *in_RDI;
  char bytes [3];
  size_t i;
  RegularExpression urlByteRe;
  string *ret;
  string *in_stack_fffffffffffffd58;
  undefined7 in_stack_fffffffffffffd60;
  byte in_stack_fffffffffffffd67;
  char local_27f;
  undefined1 local_27e;
  undefined1 local_27d;
  string local_270 [32];
  ulong local_250;
  undefined1 local_241;
  ulong local_10;
  
  local_10 = in_RSI;
  RegularExpression::RegularExpression
            ((RegularExpression *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
             (char *)in_stack_fffffffffffffd58);
  local_241 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  for (local_250 = 0; uVar3 = local_250, uVar1 = std::__cxx11::string::length(), uVar3 < uVar1;
      local_250 = local_250 + 1) {
    std::__cxx11::string::substr((ulong)local_270,local_10);
    in_stack_fffffffffffffd67 =
         RegularExpression::find
                   ((RegularExpression *)
                    CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                    in_stack_fffffffffffffd58);
    std::__cxx11::string::~string(local_270);
    if ((in_stack_fffffffffffffd67 & 1) == 0) {
      pcVar4 = (char *)std::__cxx11::string::operator[](local_10);
      std::__cxx11::string::operator+=((string *)in_RDI,*pcVar4);
    }
    else {
      pcVar4 = (char *)std::__cxx11::string::operator[](local_10);
      local_27f = *pcVar4;
      puVar2 = (undefined1 *)std::__cxx11::string::operator[](local_10);
      local_27e = *puVar2;
      local_27d = 0;
      uVar3 = strtoul(&local_27f,(char **)0x0,0x10);
      std::__cxx11::string::operator+=((string *)in_RDI,(char)uVar3);
      local_250 = local_250 + 2;
    }
  }
  local_241 = 1;
  RegularExpression::~RegularExpression
            ((RegularExpression *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
  return in_RDI;
}

Assistant:

std::string SystemTools::DecodeURL(const std::string& url)
{
  kwsys::RegularExpression urlByteRe(VTK_URL_BYTE_REGEX);
  std::string ret;
  for (size_t i = 0; i < url.length(); i++) {
    if (urlByteRe.find(url.substr(i, 3))) {
      char bytes[] = { url[i + 1], url[i + 2], '\0' };
      ret += static_cast<char>(strtoul(bytes, nullptr, 16));
      i += 2;
    } else {
      ret += url[i];
    }
  }
  return ret;
}